

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O0

void aom_highbd_quantize_b_64x64_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i dequant_02;
  __m128i dequant_03;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  __m128i qcoeff_03;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  uint uVar25;
  undefined1 (*in_RCX) [16];
  undefined8 *puVar27;
  undefined1 (*in_RDX) [16];
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong lVar28;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong in_RSI;
  int16_t *iscan_ptr;
  ulong *in_RDI;
  ulong *puVar29;
  __m128i *cmp_mask0_00;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  uint uVar35;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  ulong extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  ulong extraout_XMM0_Qa_08;
  ulong extraout_XMM0_Qa_09;
  ulong extraout_XMM0_Qa_10;
  uint uVar36;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar37;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  ulong extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  ulong extraout_XMM0_Qb_08;
  ulong extraout_XMM0_Qb_09;
  ulong extraout_XMM0_Qb_10;
  int iVar46;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong uVar47;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i alVar49;
  __m128i sign;
  __m128i sign_00;
  __m128i sign_01;
  __m128i sign_02;
  __m128i sign_03;
  __m128i sign_04;
  __m128i sign_05;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i mask;
  __m128i mask_00;
  ulong *in_stack_00000008;
  ulong *in_stack_00000010;
  undefined1 (*in_stack_00000018) [16];
  ushort *in_stack_00000020;
  long in_stack_00000028;
  int prescan_add_val;
  int factor;
  int abs_coeff;
  int coeff_sign;
  int coeff;
  int rc_3;
  int qcoeff;
  int rc_2;
  int i_3;
  int rc_1;
  int i_2;
  int rc;
  int i_1;
  __m128i shift_sign;
  __m128i dequant_sign;
  __m128i quant_sign;
  __m128i round_sign;
  __m128i zbin_sign;
  int first;
  __m128i threshold [2];
  int i;
  qm_val_t wt;
  int thresh [4];
  int prescan_add [2];
  int zbins [2];
  __m128i mask1;
  __m128i mask0;
  __m128i all_zero;
  __m128i cmp_mask;
  __m128i cmp_mask1;
  __m128i cmp_mask0;
  __m128i qcoeff1;
  __m128i qcoeff0;
  __m128i coeff1_sign;
  __m128i coeff0_sign;
  __m128i coeff1;
  __m128i coeff0;
  __m128i shift;
  __m128i dequant;
  __m128i quant;
  __m128i round;
  __m128i zbin;
  __m128i log_scale_vec;
  __m128i one;
  __m128i zero;
  int eob;
  int is_found1;
  int is_found0;
  int non_zero_count_prescan_add_zero;
  int non_zero_count;
  int log_scale;
  int index;
  int *in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a4;
  undefined4 in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5ac;
  undefined4 in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b4;
  undefined4 in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5bc;
  undefined4 in_stack_fffffffffffff5c0;
  undefined4 in_stack_fffffffffffff5c4;
  undefined4 in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5cc;
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  __m128i *qcoeff0_00;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  int local_9cc;
  undefined4 local_9b8;
  int local_9a0;
  uint local_998 [4];
  int aiStack_988 [4];
  longlong local_978 [5];
  ulong uStack_950;
  __m128i local_948;
  int local_938;
  int iStack_934;
  int iStack_930;
  int iStack_92c;
  int local_928;
  int iStack_924;
  int iStack_920;
  int iStack_91c;
  ulong local_918;
  ulong uStack_910;
  ulong local_908;
  ulong uStack_900;
  int local_8f8;
  int iStack_8f4;
  int iStack_8f0;
  int iStack_8ec;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  ulong local_8d8;
  ulong uStack_8d0;
  ulong local_8c8;
  ulong uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined4 local_898;
  undefined2 uStack_894;
  undefined2 uStack_892;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  ulong local_848;
  ulong uStack_840;
  int local_834;
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  int local_820;
  int local_81c;
  longlong local_7f8;
  ulong *local_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined4 local_7d8;
  undefined4 local_7d4;
  uint *local_7d0;
  undefined8 local_7c8;
  undefined4 uStack_7c0;
  undefined4 uStack_7bc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7ac;
  undefined8 local_7a8;
  undefined4 uStack_7a0;
  undefined4 uStack_79c;
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_78c;
  undefined4 local_788;
  undefined4 uStack_784;
  undefined4 uStack_780;
  undefined4 uStack_77c;
  uint local_778;
  undefined4 uStack_774;
  undefined4 uStack_76c;
  uint local_768;
  uint uStack_764;
  undefined4 uStack_760;
  uint uStack_75c;
  undefined4 local_758;
  uint uStack_754;
  uint uStack_74c;
  undefined8 local_748;
  undefined4 uStack_740;
  undefined4 uStack_73c;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_72c;
  undefined4 local_728;
  undefined4 uStack_724;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  undefined4 local_718;
  undefined4 uStack_714;
  undefined4 uStack_70c;
  undefined4 local_708;
  undefined4 uStack_704;
  undefined4 uStack_700;
  undefined4 uStack_6fc;
  uint local_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6ec;
  uint local_6e8;
  uint uStack_6e4;
  undefined4 uStack_6e0;
  uint uStack_6dc;
  undefined4 local_6d8;
  uint uStack_6d4;
  uint uStack_6cc;
  undefined8 local_6c8;
  int iStack_6c0;
  int iStack_6bc;
  undefined4 local_6b8;
  int iStack_6b4;
  int iStack_6ac;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_69c;
  undefined4 uStack_68c;
  ulong *local_688;
  ulong *local_680;
  ulong *local_678;
  undefined4 local_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined4 local_61c;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined4 local_5fc;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined4 local_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined4 local_5bc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined4 local_508;
  undefined4 uStack_504;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined4 local_4dc;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined4 local_4bc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined4 local_49c;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined4 local_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  ulong local_388;
  ulong uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  ulong *local_330;
  ulong *local_310;
  ulong local_308;
  ulong uStack_300;
  ulong *local_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong *local_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong *local_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong *local_290;
  ulong local_288;
  ulong uStack_280;
  ulong *local_270;
  ulong local_268;
  ulong uStack_260;
  ulong *local_250;
  ulong *local_230;
  ulong local_228;
  ulong uStack_220;
  ulong local_208;
  ulong uStack_200;
  ulong *local_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong *local_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_188;
  ulong uStack_180;
  ulong *local_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_148;
  ulong uStack_140;
  ulong local_128;
  ulong uStack_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  undefined1 (*pauVar26) [16];
  undefined8 uVar48;
  
  local_81c = 8;
  local_820 = 2;
  local_824 = 0;
  local_828 = 0;
  local_82c = 0;
  local_830 = 0;
  local_834 = -1;
  local_7e8 = 0;
  uStack_7e0 = 0;
  local_848 = 0;
  uStack_840 = 0;
  local_7d4 = 1;
  local_2c = 1;
  local_30 = 1;
  local_34 = 1;
  local_38 = 1;
  local_858 = 1;
  uStack_854 = 1;
  uStack_850 = 1;
  uStack_84c = 1;
  local_7d8 = 2;
  local_4 = 2;
  local_8 = 2;
  local_c = 2;
  local_10 = 2;
  local_868 = 2;
  uStack_864 = 2;
  uStack_860 = 2;
  uStack_85c = 2;
  local_978[2] = 0;
  local_978[3] = 0;
  local_978[0] = 0;
  local_978[1] = 0;
  aiStack_988[2] = *(short *)*in_RDX + 2 >> 2;
  aiStack_988[3] = *(short *)(*in_RDX + 2) + 2 >> 2;
  pauVar26 = in_RCX;
  for (local_9a0 = 0; local_9a0 < 2; local_9a0 = local_9a0 + 1) {
    aiStack_988[local_9a0] =
         *(short *)(*in_stack_00000018 + (long)local_9a0 * 2) * 0x145 + 0x40 >> 7;
    uVar25 = (aiStack_988[(long)local_9a0 + 2] * 0x20 + aiStack_988[local_9a0]) - 1;
    pauVar26 = (undefined1 (*) [16])(ulong)uVar25;
    local_998[local_9a0] = uVar25;
  }
  local_998[3] = local_998[1];
  local_998[2] = local_998[1];
  local_7d0 = local_998;
  uStack_6a4 = local_998[1];
  uStack_68c = local_998[1];
  local_688 = (ulong *)CONCAT44(local_688._4_4_,local_9b8);
  uStack_69c = local_998[1];
  local_9cc = -1;
  local_5b8 = *(undefined8 *)*in_RDX;
  uStack_5b0 = *(undefined8 *)(*in_RDX + 8);
  local_5d8 = *(undefined8 *)*in_RCX;
  uStack_5d0 = *(undefined8 *)(*in_RCX + 8);
  local_5f8 = *(undefined8 *)*in_R8;
  uStack_5f0 = *(undefined8 *)(*in_R8 + 8);
  local_618 = *(undefined8 *)*in_stack_00000018;
  uStack_610 = *(undefined8 *)(*in_stack_00000018 + 8);
  local_638 = *(undefined8 *)*in_R9;
  uStack_630 = *(undefined8 *)(*in_R9 + 8);
  local_5bc = 0xf;
  auVar30 = psraw(*in_RDX,ZEXT416(0xf));
  local_5dc = 0xf;
  auVar31 = psraw(*in_RCX,ZEXT416(0xf));
  local_5fc = 0xf;
  auVar32 = psraw(*in_R8,ZEXT416(0xf));
  local_61c = 0xf;
  auVar33 = psraw(*in_stack_00000018,ZEXT416(0xf));
  local_63c = 0xf;
  auVar34 = psraw(*in_R9,ZEXT416(0xf));
  local_9e8 = auVar30._0_8_;
  uStack_9e0 = auVar30._8_8_;
  local_528 = local_9e8;
  uVar16 = local_528;
  uStack_520 = uStack_9e0;
  local_518._0_2_ = (undefined2)local_5b8;
  local_518._2_2_ = (undefined2)((ulong)local_5b8 >> 0x10);
  local_518._4_2_ = (undefined2)((ulong)local_5b8 >> 0x20);
  local_518._6_2_ = (undefined2)((ulong)local_5b8 >> 0x30);
  local_528._0_2_ = auVar30._0_2_;
  local_528._2_2_ = auVar30._2_2_;
  local_528._4_2_ = auVar30._4_2_;
  local_528._6_2_ = auVar30._6_2_;
  local_878._0_4_ = CONCAT22((undefined2)local_528,(undefined2)local_518);
  local_878 = CONCAT26(local_528._2_2_,CONCAT24(local_518._2_2_,(int)local_878));
  uStack_870._0_4_ = CONCAT22(local_528._4_2_,local_518._4_2_);
  uStack_870 = CONCAT26(local_528._6_2_,CONCAT24(local_518._6_2_,(int)uStack_870));
  local_9f8 = auVar31._0_8_;
  uStack_9f0 = auVar31._8_8_;
  local_548 = local_9f8;
  uVar15 = local_548;
  uStack_540 = uStack_9f0;
  local_538._0_2_ = (undefined2)local_5d8;
  local_538._2_2_ = (undefined2)((ulong)local_5d8 >> 0x10);
  local_538._4_2_ = (undefined2)((ulong)local_5d8 >> 0x20);
  local_538._6_2_ = (undefined2)((ulong)local_5d8 >> 0x30);
  local_548._0_2_ = auVar31._0_2_;
  local_548._2_2_ = auVar31._2_2_;
  local_548._4_2_ = auVar31._4_2_;
  local_548._6_2_ = auVar31._6_2_;
  local_888._0_4_ = CONCAT22((undefined2)local_548,(undefined2)local_538);
  local_888 = CONCAT26(local_548._2_2_,CONCAT24(local_538._2_2_,(uint)local_888));
  uStack_880._0_4_ = CONCAT22(local_548._4_2_,local_538._4_2_);
  uStack_880 = CONCAT26(local_548._6_2_,CONCAT24(local_538._6_2_,(uint)uStack_880));
  local_a08 = auVar32._0_8_;
  uStack_a00 = auVar32._8_8_;
  local_568 = local_a08;
  uVar14 = local_568;
  uStack_560 = uStack_a00;
  local_558._0_2_ = (undefined2)local_5f8;
  local_558._2_2_ = (undefined2)((ulong)local_5f8 >> 0x10);
  local_558._4_2_ = (undefined2)((ulong)local_5f8 >> 0x20);
  local_558._6_2_ = (undefined2)((ulong)local_5f8 >> 0x30);
  local_568._0_2_ = auVar32._0_2_;
  local_568._2_2_ = auVar32._2_2_;
  local_568._4_2_ = auVar32._4_2_;
  local_568._6_2_ = auVar32._6_2_;
  local_898 = CONCAT22((undefined2)local_568,(undefined2)local_558);
  _local_898 = CONCAT26(local_568._2_2_,CONCAT24(local_558._2_2_,local_898));
  uStack_890 = CONCAT26(local_568._6_2_,
                        CONCAT24(local_558._6_2_,CONCAT22(local_568._4_2_,local_558._4_2_)));
  local_a18 = auVar33._0_8_;
  uStack_a10 = auVar33._8_8_;
  local_588 = local_a18;
  uVar48 = local_588;
  uStack_580 = uStack_a10;
  local_578._0_2_ = (undefined2)local_618;
  local_578._2_2_ = (undefined2)((ulong)local_618 >> 0x10);
  local_578._4_2_ = (undefined2)((ulong)local_618 >> 0x20);
  local_578._6_2_ = (undefined2)((ulong)local_618 >> 0x30);
  local_588._0_2_ = auVar33._0_2_;
  local_588._2_2_ = auVar33._2_2_;
  local_588._4_2_ = auVar33._4_2_;
  local_588._6_2_ = auVar33._6_2_;
  local_8a8._0_4_ = CONCAT22((undefined2)local_588,(undefined2)local_578);
  local_8a8 = CONCAT26(local_588._2_2_,CONCAT24(local_578._2_2_,(undefined4)local_8a8));
  uStack_8a0._0_4_ = CONCAT22(local_588._4_2_,local_578._4_2_);
  uStack_8a0 = CONCAT26(local_588._6_2_,CONCAT24(local_578._6_2_,(undefined4)uStack_8a0));
  qcoeff0_00 = auVar34._0_8_;
  uStack_a20 = auVar34._8_8_;
  uStack_5a0 = uStack_a20;
  local_598._0_2_ = (undefined2)local_638;
  local_598._2_2_ = (undefined2)((ulong)local_638 >> 0x10);
  local_598._4_2_ = (undefined2)((ulong)local_638 >> 0x20);
  local_598._6_2_ = (undefined2)((ulong)local_638 >> 0x30);
  local_5a8._0_2_ = auVar34._0_2_;
  local_5a8._2_2_ = auVar34._2_2_;
  local_5a8._4_2_ = auVar34._4_2_;
  local_5a8._6_2_ = auVar34._6_2_;
  local_8b8 = CONCAT26(local_5a8._2_2_,
                       CONCAT24(local_598._2_2_,
                                CONCAT22((undefined2)local_5a8,(undefined2)local_598)));
  uStack_8b0 = CONCAT26(local_5a8._6_2_,
                        CONCAT24(local_598._6_2_,CONCAT22(local_5a8._4_2_,local_598._4_2_)));
  local_98 = local_878;
  uVar22 = local_98;
  uStack_90 = uStack_870;
  uVar23 = uStack_90;
  local_a8 = 2;
  uStack_a4 = 2;
  uStack_a0 = 2;
  uStack_9c = 2;
  local_98._4_4_ = (int)((ulong)local_878 >> 0x20);
  uStack_90._4_4_ = (int)((ulong)uStack_870 >> 0x20);
  uVar25 = (int)local_878 + 2;
  uVar36 = (int)uStack_870 + 2;
  local_878 = CONCAT44(local_98._4_4_ + 2U,uVar25);
  uStack_870 = CONCAT44(uStack_90._4_4_ + 2U,uVar36);
  local_b8 = local_888;
  uVar20 = local_b8;
  uStack_b0 = uStack_880;
  uVar21 = uStack_b0;
  local_c8 = 2;
  uStack_c4 = 2;
  uStack_c0 = 2;
  uStack_bc = 2;
  local_b8._4_4_ = (int)((ulong)local_888 >> 0x20);
  uStack_b0._4_4_ = (int)((ulong)uStack_880 >> 0x20);
  local_888._0_4_ = (uint)local_888 + 2;
  uStack_880._0_4_ = (uint)uStack_880 + 2;
  local_888 = CONCAT44(local_b8._4_4_ + 2U,(uint)local_888);
  uStack_880 = CONCAT44(uStack_b0._4_4_ + 2U,(uint)uStack_880);
  local_58 = local_878;
  uStack_50 = uStack_870;
  local_5c = 2;
  uVar25 = uVar25 >> 2;
  uVar35 = local_98._4_4_ + 2U >> 2;
  uVar36 = uVar36 >> 2;
  uVar37 = uStack_90._4_4_ + 2U >> 2;
  local_878 = CONCAT44(uVar35,uVar25);
  uStack_870 = CONCAT44(uVar37,uVar36);
  local_78 = local_888;
  uStack_70 = uStack_880;
  local_7c = 2;
  local_888._0_4_ = (uint)local_888 >> 2;
  local_888._4_4_ = local_b8._4_4_ + 2U >> 2;
  uStack_880._0_4_ = (uint)uStack_880 >> 2;
  uStack_880._4_4_ = uStack_b0._4_4_ + 2U >> 2;
  local_4f8 = local_878;
  uStack_4f0 = uStack_870;
  local_508 = 1;
  uStack_504 = 1;
  uStack_500 = 1;
  uStack_4fc = 1;
  local_878 = CONCAT44(uVar35 - 1,uVar25 - 1);
  uStack_870 = CONCAT44(uVar37 - 1,uVar36 - 1);
  local_8c8 = *in_RDI;
  uStack_8c0 = in_RDI[1];
  local_678 = in_RDI + 2;
  local_8d8 = *local_678;
  uStack_8d0 = in_RDI[3];
  local_47c = 0x1f;
  local_478._0_4_ = (int)local_8c8;
  local_478._4_4_ = (int)(local_8c8 >> 0x20);
  uStack_470._0_4_ = (int)uStack_8c0;
  uStack_470._4_4_ = (int)(uStack_8c0 >> 0x20);
  auVar30 = ZEXT416(0x1f);
  local_8e8 = (int)local_478 >> auVar30;
  iStack_8e4 = local_478._4_4_ >> auVar30;
  iStack_8e0 = (int)uStack_470 >> auVar30;
  iStack_8dc = uStack_470._4_4_ >> auVar30;
  local_49c = 0x1f;
  local_498._0_4_ = (int)local_8d8;
  local_498._4_4_ = (int)(local_8d8 >> 0x20);
  uStack_490._0_4_ = (int)uStack_8d0;
  uStack_490._4_4_ = (int)(uStack_8d0 >> 0x20);
  auVar30 = ZEXT416(0x1f);
  local_8f8 = (int)local_498 >> auVar30;
  iStack_8f4 = local_498._4_4_ >> auVar30;
  iStack_8f0 = (int)uStack_490 >> auVar30;
  iStack_8ec = uStack_490._4_4_ >> auVar30;
  alVar49[1] = (longlong)pauVar26;
  alVar49[0] = (longlong)in_RDX;
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  local_7f8 = in_RSI;
  local_7f0 = in_RDI;
  local_5a8 = qcoeff0_00;
  local_598 = local_638;
  uStack_590 = uStack_630;
  local_588 = uVar48;
  local_578 = local_618;
  uStack_570 = uStack_610;
  local_568 = uVar14;
  local_558 = local_5f8;
  uStack_550 = uStack_5f0;
  local_548 = uVar15;
  local_538 = local_5d8;
  uStack_530 = uStack_5d0;
  local_528 = uVar16;
  local_518 = local_5b8;
  uStack_510 = uStack_5b0;
  local_498 = local_8d8;
  uStack_490 = uStack_8d0;
  local_478 = local_8c8;
  uStack_470 = uStack_8c0;
  local_b8 = uVar20;
  uStack_b0 = uVar21;
  local_98 = uVar22;
  uStack_90 = uVar23;
  local_28 = local_868;
  uStack_24 = uStack_864;
  uStack_20 = uStack_860;
  uStack_1c = uStack_85c;
  local_48 = local_858;
  uStack_44 = uStack_854;
  uStack_40 = uStack_850;
  uStack_3c = uStack_84c;
  alVar49 = invert_sign_32_sse2(a,alVar49);
  sign[0] = alVar49[1];
  sign[1] = (longlong)pauVar26;
  a_00[1] = in_RSI;
  a_00[0] = (longlong)in_RDI;
  local_908 = extraout_XMM0_Qa;
  uStack_900 = extraout_XMM0_Qb;
  invert_sign_32_sse2(a_00,sign);
  local_918 = extraout_XMM0_Qa_00;
  uStack_910 = extraout_XMM0_Qb_00;
  highbd_update_mask0(qcoeff0_00,
                      (__m128i *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                      (__m128i *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                      (int16_t *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                      (int *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                      (__m128i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  local_3f8 = local_908;
  uVar18 = local_3f8;
  uStack_3f0 = uStack_900;
  uVar19 = uStack_3f0;
  local_408 = local_878;
  uStack_400 = uStack_870;
  local_3f8._0_4_ = (int)local_908;
  local_3f8._4_4_ = (int)(local_908 >> 0x20);
  uStack_3f0._0_4_ = (int)uStack_900;
  uStack_3f0._4_4_ = (int)(uStack_900 >> 0x20);
  iVar46 = (int)((ulong)local_878 >> 0x20);
  auVar33._12_4_ = (int)((ulong)uStack_870 >> 0x20);
  local_928 = -(uint)((int)local_878 < (int)local_3f8);
  iStack_924 = -(uint)(iVar46 < local_3f8._4_4_);
  iStack_920 = -(uint)((int)uStack_870 < (int)uStack_3f0);
  iStack_91c = -(uint)(auVar33._12_4_ < uStack_3f0._4_4_);
  _local_6a8 = CONCAT44(uStack_6a4,local_868);
  local_6c8 = local_878;
  _local_6b8 = CONCAT44(iVar46,local_868);
  auVar1._4_8_ = uStack_870;
  auVar1._0_4_ = iVar46;
  auVar33._0_8_ = auVar1._0_8_ << 0x20;
  auVar33._8_4_ = iStack_6c0;
  uStack_870 = auVar33._8_8_;
  local_418 = local_918;
  uVar47 = local_418;
  uStack_410 = uStack_910;
  uVar17 = uStack_410;
  local_428 = local_878;
  local_418._0_4_ = (int)local_918;
  local_418._4_4_ = (int)(local_918 >> 0x20);
  uStack_410._0_4_ = (int)uStack_910;
  uStack_410._4_4_ = (int)(uStack_910 >> 0x20);
  local_938 = -(uint)((int)local_878 < (int)local_418);
  iStack_934 = -(uint)(iVar46 < local_418._4_4_);
  iStack_930 = -(uint)(iStack_6c0 < (int)uStack_410);
  iStack_92c = -(uint)(auVar33._12_4_ < uStack_410._4_4_);
  local_3b8 = CONCAT44(iStack_924,local_928);
  uStack_3b0 = CONCAT44(iStack_91c,iStack_920);
  local_3c8 = CONCAT44(iStack_934,local_938);
  uStack_3c0 = CONCAT44(iStack_92c,iStack_930);
  auVar31._8_8_ = uStack_3b0;
  auVar31._0_8_ = local_3b8;
  auVar30._8_8_ = uStack_3c0;
  auVar30._0_8_ = local_3c8;
  local_948 = (__m128i)packssdw(auVar31,auVar30);
  cmp_mask0_00 = &local_948;
  iscan_ptr = _factor;
  iStack_6bc = auVar33._12_4_;
  iStack_6ac = auVar33._12_4_;
  uStack_420 = uStack_870;
  local_418 = uVar47;
  uStack_410 = uVar17;
  local_3f8 = uVar18;
  uStack_3f0 = uVar19;
  highbd_update_mask1(cmp_mask0_00,_factor,&local_830,(__m128i *)local_978);
  local_378 = CONCAT44(iStack_924,local_928);
  uVar47 = CONCAT44(iStack_91c,iStack_920);
  local_388 = CONCAT44(iStack_934,local_938);
  uStack_380 = CONCAT44(iStack_92c,iStack_930);
  local_978[4] = local_378 | local_388;
  uStack_950 = uVar47 | uStack_380;
  auVar32._8_8_ = uStack_950;
  auVar32._0_8_ = local_978[4];
  uStack_370 = uVar47;
  local_358 = local_978[4];
  uStack_350 = uStack_950;
  if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar32 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar32 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar32 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (uStack_950 >> 7 & 1) == 0) && (uStack_950 >> 0xf & 1) == 0) &&
          (uStack_950 >> 0x17 & 1) == 0) && (uStack_950 >> 0x1f & 1) == 0) &&
        (uStack_950 >> 0x27 & 1) == 0) && (uStack_950 >> 0x2f & 1) == 0) &&
      (uStack_950 >> 0x37 & 1) == 0) && -1 < (long)uStack_950) {
    local_168 = local_848;
    uStack_160 = uStack_840;
    *in_stack_00000008 = local_848;
    in_stack_00000008[1] = uStack_840;
    local_170 = in_stack_00000008 + 2;
    local_188 = local_848;
    uStack_180 = uStack_840;
    *local_170 = local_848;
    in_stack_00000008[3] = uStack_840;
    local_1a8 = local_848;
    uStack_1a0 = uStack_840;
    *in_stack_00000010 = local_848;
    in_stack_00000010[1] = uStack_840;
    local_1b0 = in_stack_00000010 + 2;
    local_1c8 = local_848;
    uStack_1c0 = uStack_840;
    *local_1b0 = local_848;
    in_stack_00000010[3] = uStack_840;
    uStack_6cc = uStack_880._4_4_;
    local_6c8 = CONCAT44(local_6c8._4_4_,(int)local_878);
    uStack_6dc = uStack_880._4_4_;
    _local_6d8 = CONCAT44(local_888._4_4_,(int)local_878);
    auVar2._4_8_ = uVar47;
    auVar2._0_4_ = local_888._4_4_;
    auVar38._0_8_ = auVar2._0_8_ << 0x20;
    auVar38._8_4_ = uStack_6e0;
    auVar38._12_4_ = uStack_880._4_4_;
    uStack_880 = auVar38._8_8_;
    uStack_6ec = uStack_890._4_4_;
    _local_6e8 = CONCAT44(local_888._4_4_,(uint)local_888);
    uStack_6fc = uStack_890._4_4_;
    uStack_6f4 = (undefined4)((ulong)_local_898 >> 0x20);
    _local_6f8 = CONCAT44(uStack_6f4,(uint)local_888);
    auVar3._4_8_ = uStack_880;
    auVar3._0_4_ = uStack_6f4;
    auVar39._0_8_ = auVar3._0_8_ << 0x20;
    auVar39._8_4_ = uStack_700;
    auVar39._12_4_ = uStack_890._4_4_;
    uStack_890 = auVar39._8_8_;
    uStack_70c = uStack_8b0._4_4_;
    _local_708 = CONCAT44(uStack_6f4,(undefined4)local_8a8);
    uStack_71c = uStack_8b0._4_4_;
    uStack_714 = (undefined4)((ulong)local_8b8 >> 0x20);
    _local_718 = CONCAT44(uStack_714,(undefined4)local_8a8);
    auVar4._4_8_ = uStack_890;
    auVar4._0_4_ = uStack_714;
    auVar40._0_8_ = auVar4._0_8_ << 0x20;
    auVar40._8_4_ = uStack_720;
    auVar40._12_4_ = uStack_8b0._4_4_;
    uStack_8b0 = auVar40._8_8_;
    uStack_72c = uStack_8a0._4_4_;
    _local_728 = CONCAT44(uStack_714,local_898);
    local_748 = local_8a8;
    uStack_73c = uStack_8a0._4_4_;
    uStack_734 = (undefined4)((ulong)local_8a8 >> 0x20);
    _local_738 = CONCAT44(uStack_734,local_898);
    auVar5._4_8_ = uStack_8b0;
    auVar5._0_4_ = uStack_734;
    auVar41._0_8_ = auVar5._0_8_ << 0x20;
    auVar41._8_4_ = uStack_740;
    auVar41._12_4_ = uStack_8a0._4_4_;
    uStack_8a0 = auVar41._8_8_;
    lVar28 = extraout_RDX;
  }
  else {
    iscan_ptr = (int16_t *)&local_888;
    puVar27 = &local_8b8;
    in_stack_fffffffffffff598 = &local_820;
    highbd_calculate_qcoeff
              ((__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
               (__m128i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (__m128i *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
               (__m128i *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
               in_stack_fffffffffffff598);
    uStack_74c = uStack_880._4_4_;
    local_748 = CONCAT44(local_748._4_4_,(int)local_878);
    uStack_75c = uStack_880._4_4_;
    _local_758 = CONCAT44(local_888._4_4_,(int)local_878);
    auVar6._4_8_ = uVar47;
    auVar6._0_4_ = local_888._4_4_;
    auVar34._0_8_ = auVar6._0_8_ << 0x20;
    auVar34._8_4_ = uStack_760;
    auVar34._12_4_ = uStack_880._4_4_;
    uStack_880 = auVar34._8_8_;
    uStack_76c = uStack_890._4_4_;
    _local_768 = CONCAT44(local_888._4_4_,(uint)local_888);
    uStack_77c = uStack_890._4_4_;
    uStack_774 = (undefined4)((ulong)_local_898 >> 0x20);
    _local_778 = CONCAT44(uStack_774,(uint)local_888);
    auVar7._4_8_ = uStack_880;
    auVar7._0_4_ = uStack_774;
    auVar42._0_8_ = auVar7._0_8_ << 0x20;
    auVar42._8_4_ = uStack_780;
    auVar42._12_4_ = uStack_890._4_4_;
    uStack_890 = auVar42._8_8_;
    uStack_78c = uStack_8b0._4_4_;
    _local_788 = CONCAT44(uStack_774,(undefined4)local_8a8);
    local_7a8 = local_8b8;
    uStack_79c = uStack_8b0._4_4_;
    uStack_794 = (undefined4)((ulong)local_8b8 >> 0x20);
    _local_798 = CONCAT44(uStack_794,(undefined4)local_8a8);
    auVar8._4_8_ = uStack_890;
    auVar8._0_4_ = uStack_794;
    auVar43._0_8_ = auVar8._0_8_ << 0x20;
    auVar43._8_4_ = uStack_7a0;
    auVar43._12_4_ = uStack_8b0._4_4_;
    uStack_8b0 = auVar43._8_8_;
    puVar29 = &local_918;
    highbd_calculate_qcoeff
              ((__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
               (__m128i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (__m128i *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
               (__m128i *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
               in_stack_fffffffffffff598);
    sign_00[1] = (longlong)puVar27;
    sign_00[0] = extraout_RDX_00;
    a_01[1] = (longlong)iscan_ptr;
    a_01[0] = (longlong)puVar29;
    alVar49 = invert_sign_32_sse2(a_01,sign_00);
    sign_01[0] = alVar49[1];
    sign_01[1] = (longlong)puVar27;
    a_02[1] = (longlong)iscan_ptr;
    a_02[0] = (longlong)puVar29;
    local_908 = extraout_XMM0_Qa_01;
    uStack_900 = extraout_XMM0_Qb_01;
    invert_sign_32_sse2(a_02,sign_01);
    local_e8 = CONCAT44(iStack_924,local_928);
    uStack_e0 = CONCAT44(iStack_91c,iStack_920);
    local_d8 = local_908;
    uStack_d0 = uStack_900;
    local_908 = local_908 & local_e8;
    uStack_900 = uStack_900 & uStack_e0;
    local_108 = CONCAT44(iStack_934,local_938);
    uStack_100 = CONCAT44(iStack_92c,iStack_930);
    local_918 = extraout_XMM0_Qa_02 & local_108;
    uStack_910 = extraout_XMM0_Qb_02 & uStack_100;
    *in_stack_00000008 = local_908;
    in_stack_00000008[1] = uStack_900;
    local_1f0 = in_stack_00000008 + 2;
    *local_1f0 = local_918;
    in_stack_00000008[3] = uStack_910;
    auVar9._4_8_ = uStack_100;
    auVar9._0_4_ = local_8a8._4_4_;
    auVar44._0_8_ = auVar9._0_8_ << 0x20;
    auVar44._8_4_ = (undefined4)uStack_8a0;
    auVar44._12_4_ = uStack_8a0._4_4_;
    uVar48 = auVar44._8_8_;
    qcoeff_00[0]._4_4_ = in_stack_fffffffffffff5b4;
    qcoeff_00[0]._0_4_ = in_stack_fffffffffffff5b0;
    qcoeff_00[1]._0_4_ = in_stack_fffffffffffff5b8;
    qcoeff_00[1]._4_4_ = in_stack_fffffffffffff5bc;
    dequant_00[0]._4_4_ = in_stack_fffffffffffff5a4;
    dequant_00[0]._0_4_ = in_stack_fffffffffffff5a0;
    dequant_00[1]._0_4_ = in_stack_fffffffffffff5a8;
    dequant_00[1]._4_4_ = in_stack_fffffffffffff5ac;
    local_208 = local_918;
    uStack_200 = uStack_910;
    local_1e8 = local_908;
    uStack_1e0 = uStack_900;
    highbd_calculate_dqcoeff(qcoeff_00,dequant_00,(int)((ulong)in_stack_fffffffffffff598 >> 0x20));
    uStack_7ac = uStack_8a0._4_4_;
    local_7a8 = CONCAT44(local_7a8._4_4_,local_898);
    local_7c8 = local_8a8;
    uStack_7bc = uStack_8a0._4_4_;
    uStack_7b4 = (undefined4)((ulong)local_8a8 >> 0x20);
    _local_7b8 = CONCAT44(uStack_7b4,local_898);
    auVar10._4_8_ = uVar48;
    auVar10._0_4_ = uStack_7b4;
    auVar45._0_8_ = auVar10._0_8_ << 0x20;
    auVar45._8_4_ = uStack_7c0;
    auVar45._12_4_ = uStack_8a0._4_4_;
    uStack_8a0 = auVar45._8_8_;
    cmp_mask0_00 = (__m128i *)0x2;
    qcoeff_01[0]._4_4_ = in_stack_fffffffffffff5b4;
    qcoeff_01[0]._0_4_ = in_stack_fffffffffffff5b0;
    qcoeff_01[1]._0_4_ = in_stack_fffffffffffff5b8;
    qcoeff_01[1]._4_4_ = in_stack_fffffffffffff5bc;
    dequant_01[0]._4_4_ = in_stack_fffffffffffff5a4;
    dequant_01[0]._0_4_ = in_stack_fffffffffffff5a0;
    dequant_01[1]._0_4_ = in_stack_fffffffffffff5a8;
    dequant_01[1]._4_4_ = in_stack_fffffffffffff5ac;
    local_8c8 = extraout_XMM0_Qa_03;
    uStack_8c0 = extraout_XMM0_Qb_03;
    alVar49 = highbd_calculate_dqcoeff
                        (qcoeff_01,dequant_01,(int)((ulong)in_stack_fffffffffffff598 >> 0x20));
    lVar28 = alVar49[1];
    local_228 = local_8c8;
    uStack_220 = uStack_8c0;
    *in_stack_00000010 = local_8c8;
    in_stack_00000010[1] = uStack_8c0;
    local_230 = in_stack_00000010 + 2;
    *local_230 = extraout_XMM0_Qa_04;
    in_stack_00000010[3] = extraout_XMM0_Qb_04;
    local_8d8 = extraout_XMM0_Qa_04;
    uStack_8d0 = extraout_XMM0_Qb_04;
  }
  while (local_81c < local_7f8) {
    local_680 = (ulong *)((long)local_7f0 + (long)local_81c * 4);
    local_8c8 = *local_680;
    uStack_8c0 = local_680[1];
    sign_02[1] = (long)local_81c;
    local_688 = (ulong *)((long)local_7f0 + sign_02[1] * 4 + 0x10);
    local_8d8 = *local_688;
    uStack_8d0 = local_688[1];
    local_4bc = 0x1f;
    local_4b8._0_4_ = (int)local_8c8;
    local_4b8._4_4_ = (int)(local_8c8 >> 0x20);
    uStack_4b0._0_4_ = (int)uStack_8c0;
    uStack_4b0._4_4_ = (int)(uStack_8c0 >> 0x20);
    auVar30 = ZEXT416(0x1f);
    local_8e8 = (int)local_4b8 >> auVar30;
    iStack_8e4 = local_4b8._4_4_ >> auVar30;
    iStack_8e0 = (int)uStack_4b0 >> auVar30;
    iStack_8dc = uStack_4b0._4_4_ >> auVar30;
    local_4dc = 0x1f;
    local_4d8._0_4_ = (int)local_8d8;
    local_4d8._4_4_ = (int)(local_8d8 >> 0x20);
    uStack_4d0._0_4_ = (int)uStack_8d0;
    uStack_4d0._4_4_ = (int)(uStack_8d0 >> 0x20);
    auVar30 = ZEXT416(0x1f);
    local_8f8 = (int)local_4d8 >> auVar30;
    iStack_8f4 = local_4d8._4_4_ >> auVar30;
    iStack_8f0 = (int)uStack_4d0 >> auVar30;
    iStack_8ec = uStack_4d0._4_4_ >> auVar30;
    sign_02[0] = lVar28;
    a_03[1] = (longlong)iscan_ptr;
    a_03[0] = (longlong)cmp_mask0_00;
    local_4d8 = local_8d8;
    uStack_4d0 = uStack_8d0;
    local_4b8 = local_8c8;
    uStack_4b0 = uStack_8c0;
    alVar49 = invert_sign_32_sse2(a_03,sign_02);
    sign_03[0] = alVar49[1];
    sign_03[1] = sign_02[1];
    a_04[1] = (longlong)iscan_ptr;
    a_04[0] = (longlong)cmp_mask0_00;
    local_908 = extraout_XMM0_Qa_05;
    uStack_900 = extraout_XMM0_Qb_05;
    invert_sign_32_sse2(a_04,sign_03);
    local_918 = extraout_XMM0_Qa_06;
    uStack_910 = extraout_XMM0_Qb_06;
    highbd_update_mask0(qcoeff0_00,
                        (__m128i *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                        (__m128i *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                        (int16_t *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                        (int *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                        (__m128i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
    local_438 = local_908;
    uVar18 = local_438;
    uStack_430 = uStack_900;
    uVar19 = uStack_430;
    local_448 = local_878;
    uVar48 = local_448;
    uStack_440 = uStack_870;
    uVar14 = uStack_440;
    local_438._0_4_ = (int)local_908;
    local_438._4_4_ = (int)(local_908 >> 0x20);
    uStack_430._0_4_ = (int)uStack_900;
    uStack_430._4_4_ = (int)(uStack_900 >> 0x20);
    local_448._0_4_ = (int)local_878;
    local_448._4_4_ = (int)((ulong)local_878 >> 0x20);
    uStack_440._0_4_ = (int)uStack_870;
    uStack_440._4_4_ = (int)((ulong)uStack_870 >> 0x20);
    local_928 = -(uint)((int)local_448 < (int)local_438);
    iStack_924 = -(uint)(local_448._4_4_ < local_438._4_4_);
    iStack_920 = -(uint)((int)uStack_440 < (int)uStack_430);
    iStack_91c = -(uint)(uStack_440._4_4_ < uStack_430._4_4_);
    local_458 = local_918;
    uVar47 = local_458;
    uStack_450 = uStack_910;
    uVar17 = uStack_450;
    local_468 = local_878;
    uStack_460 = uStack_870;
    local_458._0_4_ = (int)local_918;
    local_458._4_4_ = (int)(local_918 >> 0x20);
    uStack_450._0_4_ = (int)uStack_910;
    uStack_450._4_4_ = (int)(uStack_910 >> 0x20);
    local_938 = -(uint)((int)local_448 < (int)local_458);
    iStack_934 = -(uint)(local_448._4_4_ < local_458._4_4_);
    iStack_930 = -(uint)((int)uStack_440 < (int)uStack_450);
    iStack_92c = -(uint)(uStack_440._4_4_ < uStack_450._4_4_);
    local_3d8 = CONCAT44(iStack_924,local_928);
    uStack_3d0 = CONCAT44(iStack_91c,iStack_920);
    local_3e8 = CONCAT44(iStack_934,local_938);
    uStack_3e0 = CONCAT44(iStack_92c,iStack_930);
    auVar12._8_8_ = uStack_3d0;
    auVar12._0_8_ = local_3d8;
    auVar11._8_8_ = uStack_3e0;
    auVar11._0_8_ = local_3e8;
    local_948 = (__m128i)packssdw(auVar12,auVar11);
    iscan_ptr = _factor + local_81c;
    cmp_mask0_00 = &local_948;
    local_458 = uVar47;
    uStack_450 = uVar17;
    local_448 = uVar48;
    uStack_440 = uVar14;
    local_438 = uVar18;
    uStack_430 = uVar19;
    highbd_update_mask1(cmp_mask0_00,iscan_ptr,&local_830,(__m128i *)local_978);
    local_398 = CONCAT44(iStack_924,local_928);
    uStack_390 = CONCAT44(iStack_91c,iStack_920);
    local_3a8 = CONCAT44(iStack_934,local_938);
    uStack_3a0 = CONCAT44(iStack_92c,iStack_930);
    local_978[4] = local_398 | local_3a8;
    uStack_950 = uStack_390 | uStack_3a0;
    auVar13._8_8_ = uStack_950;
    auVar13._0_8_ = local_978[4];
    local_368 = local_978[4];
    uStack_360 = uStack_950;
    if ((((((((((((((((auVar13 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar13 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar13 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar13 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar13 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar13 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (uStack_950 >> 7 & 1) == 0) && (uStack_950 >> 0xf & 1) == 0) &&
            (uStack_950 >> 0x17 & 1) == 0) && (uStack_950 >> 0x1f & 1) == 0) &&
          (uStack_950 >> 0x27 & 1) == 0) && (uStack_950 >> 0x2f & 1) == 0) &&
        (uStack_950 >> 0x37 & 1) == 0) && -1 < (long)uStack_950) {
      local_250 = (ulong *)((long)in_stack_00000008 + (long)local_81c * 4);
      local_268 = local_848;
      uStack_260 = uStack_840;
      *local_250 = local_848;
      local_250[1] = uStack_840;
      local_270 = (ulong *)((long)in_stack_00000008 + (long)local_81c * 4 + 0x10);
      local_288 = local_848;
      uStack_280 = uStack_840;
      *local_270 = local_848;
      *(ulong *)((long)in_stack_00000008 + (long)local_81c * 4 + 0x18) = uStack_840;
      local_290 = (ulong *)((long)in_stack_00000010 + (long)local_81c * 4);
      local_2a8 = local_848;
      uStack_2a0 = uStack_840;
      *local_290 = local_848;
      local_290[1] = uStack_840;
      local_2b0 = (ulong *)((long)in_stack_00000010 + (long)local_81c * 4 + 0x10);
      local_2c8 = local_848;
      uStack_2c0 = uStack_840;
      *local_2b0 = local_848;
      *(ulong *)((long)in_stack_00000010 + (long)local_81c * 4 + 0x18) = uStack_840;
      local_81c = local_81c + 8;
      lVar28 = extraout_RDX_01;
    }
    else {
      highbd_calculate_qcoeff
                ((__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff598);
      puVar29 = &local_918;
      iscan_ptr = (int16_t *)&local_888;
      puVar27 = &local_8b8;
      highbd_calculate_qcoeff
                ((__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff598);
      sign_04[1] = (longlong)puVar27;
      sign_04[0] = extraout_RDX_02;
      a_05[1] = (longlong)iscan_ptr;
      a_05[0] = (longlong)puVar29;
      alVar49 = invert_sign_32_sse2(a_05,sign_04);
      sign_05[0] = alVar49[1];
      sign_05[1] = (longlong)puVar27;
      a_06[1] = (longlong)iscan_ptr;
      a_06[0] = (longlong)puVar29;
      local_908 = extraout_XMM0_Qa_07;
      uStack_900 = extraout_XMM0_Qb_07;
      invert_sign_32_sse2(a_06,sign_05);
      local_128 = CONCAT44(iStack_924,local_928);
      uStack_120 = CONCAT44(iStack_91c,iStack_920);
      local_118 = local_908;
      uStack_110 = uStack_900;
      local_908 = local_908 & local_128;
      uStack_900 = uStack_900 & uStack_120;
      local_148 = CONCAT44(iStack_934,local_938);
      uStack_140 = CONCAT44(iStack_92c,iStack_930);
      local_918 = extraout_XMM0_Qa_08 & local_148;
      uStack_910 = extraout_XMM0_Qb_08 & uStack_140;
      local_2d0 = (ulong *)((long)in_stack_00000008 + (long)local_81c * 4);
      *local_2d0 = local_908;
      local_2d0[1] = uStack_900;
      local_2f0 = (ulong *)((long)in_stack_00000008 + (long)local_81c * 4 + 0x10);
      *local_2f0 = local_918;
      *(ulong *)((long)in_stack_00000008 + (long)local_81c * 4 + 0x18) = uStack_910;
      qcoeff_02[0]._4_4_ = in_stack_fffffffffffff5b4;
      qcoeff_02[0]._0_4_ = in_stack_fffffffffffff5b0;
      qcoeff_02[1]._0_4_ = in_stack_fffffffffffff5b8;
      qcoeff_02[1]._4_4_ = in_stack_fffffffffffff5bc;
      dequant_02[0]._4_4_ = in_stack_fffffffffffff5a4;
      dequant_02[0]._0_4_ = in_stack_fffffffffffff5a0;
      dequant_02[1]._0_4_ = in_stack_fffffffffffff5a8;
      dequant_02[1]._4_4_ = in_stack_fffffffffffff5ac;
      local_308 = local_918;
      uStack_300 = uStack_910;
      local_2e8 = local_908;
      uStack_2e0 = uStack_900;
      highbd_calculate_dqcoeff(qcoeff_02,dequant_02,(int)((ulong)in_stack_fffffffffffff598 >> 0x20))
      ;
      cmp_mask0_00 = (__m128i *)0x2;
      qcoeff_03[0]._4_4_ = in_stack_fffffffffffff5b4;
      qcoeff_03[0]._0_4_ = in_stack_fffffffffffff5b0;
      qcoeff_03[1]._0_4_ = in_stack_fffffffffffff5b8;
      qcoeff_03[1]._4_4_ = in_stack_fffffffffffff5bc;
      dequant_03[0]._4_4_ = in_stack_fffffffffffff5a4;
      dequant_03[0]._0_4_ = in_stack_fffffffffffff5a0;
      dequant_03[1]._0_4_ = in_stack_fffffffffffff5a8;
      dequant_03[1]._4_4_ = in_stack_fffffffffffff5ac;
      local_8c8 = extraout_XMM0_Qa_09;
      uStack_8c0 = extraout_XMM0_Qb_09;
      alVar49 = highbd_calculate_dqcoeff
                          (qcoeff_03,dequant_03,(int)((ulong)in_stack_fffffffffffff598 >> 0x20));
      lVar28 = alVar49[1];
      local_310 = (ulong *)((long)in_stack_00000010 + (long)local_81c * 4);
      *local_310 = local_8c8;
      local_310[1] = uStack_8c0;
      local_330 = (ulong *)((long)in_stack_00000010 + (long)local_81c * 4 + 0x10);
      *local_330 = extraout_XMM0_Qa_10;
      *(ulong *)((long)in_stack_00000010 + (long)local_81c * 4 + 0x18) = extraout_XMM0_Qb_10;
      local_81c = local_81c + 8;
      local_8d8 = extraout_XMM0_Qa_10;
      uStack_8d0 = extraout_XMM0_Qb_10;
    }
  }
  if (local_82c != 0) {
    mask[1] = (longlong)iscan_ptr;
    mask[0] = (longlong)cmp_mask0_00;
    local_824 = calculate_non_zero_count(mask);
  }
  if (local_830 != 0) {
    mask_00[1] = (longlong)iscan_ptr;
    mask_00[0] = (longlong)cmp_mask0_00;
    local_828 = calculate_non_zero_count(mask_00);
  }
  while (local_828 = local_828 + -1, iVar46 = local_824, local_824 <= local_828) {
    iVar46 = (int)*(short *)(in_stack_00000028 + (long)local_828 * 2);
    *(undefined4 *)((long)in_stack_00000008 + (long)iVar46 * 4) = 0;
    *(undefined4 *)((long)in_stack_00000010 + (long)iVar46 * 4) = 0;
  }
  do {
    iVar46 = iVar46 + -1;
    iVar24 = local_834;
    if (iVar46 < 0) break;
    iVar24 = iVar46;
  } while (*(int *)((long)in_stack_00000008 +
                   (long)(int)*(short *)(in_stack_00000028 + (long)iVar46 * 2) * 4) == 0);
  local_834 = iVar24;
  *in_stack_00000020 = (short)local_834 + 1;
  iVar46 = 0;
  while ((iVar24 = local_9cc, iVar46 < local_824 &&
         (iVar24 = iVar46,
         *(int *)((long)in_stack_00000008 +
                 (long)(int)*(short *)(in_stack_00000028 + (long)iVar46 * 2) * 4) == 0))) {
    iVar46 = iVar46 + 1;
  }
  local_9cc = iVar24;
  if (((-1 < (int)(*in_stack_00000020 - 1)) && (local_9cc == *in_stack_00000020 - 1)) &&
     ((iVar46 = (int)*(short *)(in_stack_00000028 + (long)(int)(*in_stack_00000020 - 1) * 2),
      *(int *)((long)in_stack_00000008 + (long)iVar46 * 4) == 1 ||
      (*(int *)((long)in_stack_00000008 + (long)iVar46 * 4) == -1)))) {
    uVar25 = *(int *)((long)local_7f0 + (long)iVar46 * 4) << 5;
    uVar35 = 0;
    if ((int)uVar25 < 0) {
      uVar35 = 0xffffffff;
    }
    if ((int)((uVar25 ^ uVar35) - uVar35) <
        aiStack_988[(long)(int)(uint)(iVar46 != 0) + 2] * 0x20 +
        (*(short *)(*in_stack_00000018 + (long)(int)(uint)(iVar46 != 0) * 2) * 0x20d + 0x40 >> 7)) {
      *(undefined4 *)((long)in_stack_00000008 + (long)iVar46 * 4) = 0;
      *(undefined4 *)((long)in_stack_00000010 + (long)iVar46 * 4) = 0;
      *in_stack_00000020 = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_64x64_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 2;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  const __m128i log_scale_vec = _mm_set1_epi32(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);

  // Shift with rounding.
  zbin = _mm_add_epi32(zbin, log_scale_vec);
  round = _mm_add_epi32(round, log_scale_vec);
  zbin = _mm_srli_epi32(zbin, log_scale);
  round = _mm_srli_epi32(round, log_scale);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}